

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_remove_many(void)

{
  sbs_t *psVar1;
  uint64_t uVar2;
  uint32_t values [8];
  uint32_t local_48 [10];
  
  psVar1 = sbs_create();
  sbs_add_range(psVar1,0,0x1ffff);
  local_48[4] = 0x10001;
  local_48[5] = 0x10003;
  local_48[6] = 0x10005;
  local_48[7] = 0x10007;
  local_48[0] = 1;
  local_48[1] = 3;
  local_48[2] = 5;
  local_48[3] = 7;
  sbs_remove_many(psVar1,8,local_48);
  sbs_compare(psVar1);
  sbs_free(psVar1);
  psVar1 = sbs_create();
  sbs_add_range(psVar1,0,0x1ffff);
  local_48[4] = 1;
  local_48[5] = 0x10001;
  local_48[6] = 0x10003;
  local_48[7] = 3;
  local_48[0] = 0x10007;
  local_48[1] = 0x10005;
  local_48[2] = 7;
  local_48[3] = 5;
  sbs_remove_many(psVar1,8,local_48);
  sbs_compare(psVar1);
  sbs_free(psVar1);
  psVar1 = sbs_create();
  roaring_bitmap_add(psVar1->roaring,500);
  sbs_ensure_room(psVar1,500);
  psVar1->words[7] = psVar1->words[7] | 0x10000000000000;
  local_48[0] = 0x1f5;
  local_48[1] = 80000;
  sbs_remove_many(psVar1,2,local_48);
  roaring_bitmap_remove_many(psVar1->roaring,0,(uint32_t *)0x0);
  sbs_compare(psVar1);
  sbs_free(psVar1);
  psVar1 = sbs_create();
  sbs_add_range(psVar1,0,0xffff);
  local_48[0] = 0;
  do {
    sbs_remove_many(psVar1,1,local_48);
    uVar2 = roaring_bitmap_get_cardinality(psVar1->roaring);
    _assert_true((ulong)(uVar2 == 0xffff - local_48[0]),
                 "roaring_bitmap_get_cardinality(sbs->roaring) == 65535 - v",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1175);
    local_48[0] = local_48[0] + 1;
  } while (local_48[0] < 0x10000);
  _assert_true((ulong)((psVar1->roaring->high_low_container).size == 0),"sbs_is_empty(sbs)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x1177);
  sbs_free(psVar1);
  return;
}

Assistant:

DEFINE_TEST(test_remove_many) {
    // multiple values per container (sorted)
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65536 * 2 - 1);
        uint32_t values[] = {1,         3,         5,         7,
                             65536 + 1, 65536 + 3, 65536 + 5, 65536 + 7};
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // multiple values per container (interleaved)
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65536 * 2 - 1);
        uint32_t values[] = {65536 + 7, 65536 + 5, 7,         5,
                             1,         65536 + 1, 65536 + 3, 3};
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // no-op checks
    {
        sbs_t *sbs = sbs_create();
        sbs_add_value(sbs, 500);
        uint32_t values[] = {501, 80000};  // non-existent value/container
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_remove_many(sbs, 0, NULL);  // NULL ptr is not dereferenced
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // container type changes and container removal
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65535);
        for (uint32_t v = 0; v <= 65535; v++) {
            sbs_remove_many(sbs, 1, &v);
            assert_true(roaring_bitmap_get_cardinality(sbs->roaring) ==
                        65535 - v);
        }
        assert_true(sbs_is_empty(sbs));
        sbs_free(sbs);
    }
}